

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db>
unodb::detail::
make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db>
          (art_key_type k,value_view v,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db)

{
  undefined1 *size;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this;
  length_error *this_00;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *in_R8;
  value_view v_00;
  basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db> bVar1;
  _Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
  extraout_RDX;
  
  v_00._M_ptr = v._M_extent._M_extent_value;
  if ((ulong)db >> 0x20 == 0) {
    size = (undefined1 *)((long)(db->node_counts)._M_elems + 3);
    this = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)
           allocate_aligned((size_t)size,0x10);
    db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::increment_leaf_count
              (in_R8,(size_t)size);
    v_00._M_extent._M_extent_value = (size_t)db;
    basic_leaf<unsigned_long,_unodb::detail::node_header>::basic_leaf
              (this,(art_key_type)v._M_ptr,v_00);
    *(db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> **)k.field_0 = in_R8;
    *(basic_leaf<unsigned_long,_unodb::detail::node_header> **)((long)k.field_0 + 8) = this;
    bVar1._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
    ._M_head_impl = extraout_RDX._M_head_impl;
    bVar1._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )(_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
            )k.field_0;
    return (basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db>
            )bVar1._M_t.
             super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"Value length must fit in std::uint32_t");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

[[nodiscard]] auto make_db_leaf_ptr(
    basic_art_key<Key> k, value_view v,
    Db<Key, Value> &db UNODB_DETAIL_LIFETIMEBOUND) {
  using db_type = Db<Key, Value>;
  using header_type = typename db_type::header_type;
  using leaf_type = basic_leaf<Key, header_type>;

  // TODO(thompsonbry) We should have a discussion about limits.  To
  // my mind, limits should be explicit configuration values, not
  // uint32_t.
  if constexpr (std::is_same_v<Key, key_view>) {
    if (UNODB_DETAIL_UNLIKELY(k.size() > leaf_type::max_key_size)) {
      throw std::length_error("Key length must fit in std::uint32_t");
    }
  }

  if (UNODB_DETAIL_UNLIKELY(v.size_bytes() > leaf_type::max_value_size)) {
    throw std::length_error("Value length must fit in std::uint32_t");
  }

  const auto size = leaf_type::compute_size(
      static_cast<typename leaf_type::key_size_type>(k.size()),
      static_cast<typename leaf_type::value_size_type>(v.size_bytes()));

  auto *const leaf_mem = static_cast<std::byte *>(
      allocate_aligned(size, alignment_for_new<leaf_type>()));

#ifdef UNODB_DETAIL_WITH_STATS
  db.increment_leaf_count(size);
#endif  // UNODB_DETAIL_WITH_STATS

  return basic_db_leaf_unique_ptr<Key, Value, header_type, Db>{
      new (leaf_mem) leaf_type{k, v}, basic_db_leaf_deleter<db_type>{db}};
}